

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O0

uint * __thiscall Minisat::Queue<unsigned_int>::operator[](Queue<unsigned_int> *this,int index)

{
  int iVar1;
  Size SVar2;
  uint *puVar3;
  int index_local;
  Queue<unsigned_int> *this_local;
  
  if (index < 0) {
    __assert_fail("index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Queue.h"
                  ,0x2d,"T &Minisat::Queue<unsigned int>::operator[](int) [T = unsigned int]");
  }
  iVar1 = size(this);
  if (index < iVar1) {
    iVar1 = this->first;
    SVar2 = vec<unsigned_int,_int>::size(&this->buf);
    puVar3 = vec<unsigned_int,_int>::operator[](&this->buf,(iVar1 + index) % SVar2);
    return puVar3;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Queue.h"
                ,0x2d,"T &Minisat::Queue<unsigned int>::operator[](int) [T = unsigned int]");
}

Assistant:

T&       operator [] (int index)        { assert(index >= 0); assert(index < size()); return buf[(first + index) % buf.size()]; }